

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

int64_t utext_getPreviousNativeIndex_63(UText *ut)

{
  int iVar1;
  uint uVar2;
  int64_t iVar3;
  
  iVar1 = ut->chunkOffset;
  if (iVar1 < 1) {
    if ((iVar1 == 0) && (ut->chunkNativeStart == 0)) {
      return 0;
    }
  }
  else {
    uVar2 = iVar1 - 1;
    if ((ut->chunkContents[uVar2] & 0xfc00U) != 0xdc00) {
      if ((int)uVar2 <= ut->nativeIndexingLimit) {
        return (ulong)uVar2 + ut->chunkNativeStart;
      }
      ut->chunkOffset = uVar2;
      iVar3 = (*ut->pFuncs->mapOffsetToNative)(ut);
      ut->chunkOffset = ut->chunkOffset + 1;
      return iVar3;
    }
  }
  utext_previous32_63(ut);
  if (ut->nativeIndexingLimit < ut->chunkOffset) {
    iVar3 = (*ut->pFuncs->mapOffsetToNative)(ut);
  }
  else {
    iVar3 = (long)ut->chunkOffset + ut->chunkNativeStart;
  }
  utext_next32_63(ut);
  return iVar3;
}

Assistant:

U_CAPI int64_t U_EXPORT2
utext_getPreviousNativeIndex(UText *ut) {
    //
    //  Fast-path the common case.
    //     Common means current position is not at the beginning of a chunk
    //     and the preceding character is not supplementary.
    //
    int32_t i = ut->chunkOffset - 1;
    int64_t result;
    if (i >= 0) {
        UChar c = ut->chunkContents[i];
        if (U16_IS_TRAIL(c) == FALSE) {
            if (i <= ut->nativeIndexingLimit) {
                result = ut->chunkNativeStart + i;
            } else {
                ut->chunkOffset = i;
                result = ut->pFuncs->mapOffsetToNative(ut);
                ut->chunkOffset++;
            }
            return result;
        }
    }

    // If at the start of text, simply return 0.
    if (ut->chunkOffset==0 && ut->chunkNativeStart==0) {
        return 0;
    }

    // Harder, less common cases.  We are at a chunk boundary, or on a surrogate.
    //    Keep it simple, use other functions to handle the edges.
    //
    utext_previous32(ut);
    result = UTEXT_GETNATIVEINDEX(ut);
    utext_next32(ut);
    return result;
}